

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O0

void Utils::print_vec_from_to
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *vec,int from,int to)

{
  ostream *poVar1;
  reference pvVar2;
  int local_20;
  int local_1c;
  int i;
  int count;
  int to_local;
  int from_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *vec_local;
  
  local_1c = 0;
  for (local_20 = from; local_20 < to; local_20 = local_20 + 1) {
    if (0x18 < local_1c) {
      poVar1 = (ostream *)
               std::ostream::operator<<
                         ((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
      std::operator<<(poVar1,"                                    ");
      local_1c = 0;
    }
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,std::hex);
    pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (vec,(long)local_20);
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,*pvVar2);
    std::operator<<(poVar1,' ');
    local_1c = local_1c + 1;
  }
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void Utils::print_vec_from_to(std::vector<unsigned int> vec, int from, int to) {
    int count = 0;
    for (int i = from; i < to; ++i) {
        if(count >= 25) {
            std::cout << endl << "                                    ";
            count = 0;
        }
        std::cout << hex << vec[i] << ' ';
        ++count;
    }
    std::cout << endl;
}